

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr2;
  sockaddr_in addr1;
  uv_tcp_t server;
  undefined1 auStack_750 [12];
  undefined8 uStack_744;
  undefined4 uStack_73c;
  uv_tcp_t uStack_738;
  uv_loop_t *puStack_660;
  long lStack_650;
  long lStack_648;
  uv_shutdown_t uStack_640;
  sockaddr_in sStack_5e8;
  uv_write_t uStack_5d8;
  uv_buf_t uStack_510;
  uv_tcp_t uStack_500;
  uv_loop_t *puStack_428;
  long lStack_418;
  long lStack_410;
  uv_tcp_t uStack_408;
  uv_loop_t *puStack_330;
  long lStack_320;
  long lStack_318;
  sockaddr_in sStack_310;
  uv_tcp_t uStack_300;
  uv_loop_t *puStack_228;
  long lStack_218;
  long lStack_210;
  sockaddr_in sStack_208;
  uv_tcp_t uStack_1f8;
  uv_loop_t *puStack_120;
  long local_110;
  long local_108;
  sockaddr_in local_100;
  sockaddr_in local_f0;
  uv_tcp_t local_e0;
  
  puStack_120 = (uv_loop_t *)0x1c32a2;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_f0);
  local_e0.data = (void *)(long)iVar1;
  local_100.sin_family = 0;
  local_100.sin_port = 0;
  local_100.sin_addr.s_addr = 0;
  if (local_e0.data == (void *)0x0) {
    puStack_120 = (uv_loop_t *)0x1c32d8;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&local_100);
    local_e0.data = (void *)(long)iVar1;
    local_110 = 0;
    if (local_e0.data != (void *)0x0) goto LAB_001c343c;
    puStack_120 = (uv_loop_t *)0x1c32fd;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x1c330a;
    iVar1 = uv_tcp_init(puVar2,&local_e0);
    local_110 = (long)iVar1;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001c344b;
    puStack_120 = (uv_loop_t *)0x1c333b;
    iVar1 = uv_tcp_bind(&local_e0,(sockaddr *)&local_f0,0);
    local_110 = (long)iVar1;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001c345a;
    puStack_120 = (uv_loop_t *)0x1c336c;
    iVar1 = uv_tcp_bind(&local_e0,(sockaddr *)&local_100,0);
    local_110 = (long)iVar1;
    local_108 = -0x16;
    if (local_110 != -0x16) goto LAB_001c3469;
    puStack_120 = (uv_loop_t *)0x1c339d;
    uv_close((uv_handle_t *)&local_e0,close_cb);
    puStack_120 = (uv_loop_t *)0x1c33a2;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x1c33ac;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_110 = 1;
    local_108 = (long)close_cb_called;
    if (local_108 != 1) goto LAB_001c3478;
    puStack_120 = (uv_loop_t *)0x1c33d6;
    unaff_RBX = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x1c33ea;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_120 = (uv_loop_t *)0x1c33f4;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_110 = 0;
    puStack_120 = (uv_loop_t *)0x1c3402;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x1c340a;
    iVar1 = uv_loop_close(puVar2);
    local_108 = (long)iVar1;
    if (local_110 == local_108) {
      puStack_120 = (uv_loop_t *)0x1c3422;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_120 = (uv_loop_t *)0x1c343c;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c343c:
    puStack_120 = (uv_loop_t *)0x1c344b;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c344b:
    puStack_120 = (uv_loop_t *)0x1c345a;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c345a:
    puStack_120 = (uv_loop_t *)0x1c3469;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c3469:
    puStack_120 = (uv_loop_t *)0x1c3478;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c3478:
    puStack_120 = (uv_loop_t *)0x1c3487;
    run_test_tcp_bind_error_inval_cold_6();
  }
  puStack_120 = (uv_loop_t *)run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  puStack_228 = (uv_loop_t *)0x1c34b4;
  puStack_120 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_208);
  uStack_1f8.data = (void *)(long)iVar1;
  lStack_218 = 0;
  if (uStack_1f8.data == (void *)0x0) {
    puStack_228 = (uv_loop_t *)0x1c34d9;
    puVar2 = uv_default_loop();
    puStack_228 = (uv_loop_t *)0x1c34e6;
    iVar1 = uv_tcp_init(puVar2,&uStack_1f8);
    lStack_218 = (long)iVar1;
    lStack_210 = 0;
    if (lStack_218 != 0) goto LAB_001c359e;
    puStack_228 = (uv_loop_t *)0x1c3517;
    iVar1 = uv_tcp_bind(&uStack_1f8,(sockaddr *)&sStack_208,0);
    lStack_218 = (long)iVar1;
    lStack_210 = 0;
    if (lStack_218 != 0) goto LAB_001c35ad;
    puStack_228 = (uv_loop_t *)0x1c3538;
    unaff_RBX = uv_default_loop();
    puStack_228 = (uv_loop_t *)0x1c354c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_228 = (uv_loop_t *)0x1c3556;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_218 = 0;
    puStack_228 = (uv_loop_t *)0x1c3564;
    puVar2 = uv_default_loop();
    puStack_228 = (uv_loop_t *)0x1c356c;
    iVar1 = uv_loop_close(puVar2);
    lStack_210 = (long)iVar1;
    if (lStack_218 == lStack_210) {
      puStack_228 = (uv_loop_t *)0x1c3584;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_228 = (uv_loop_t *)0x1c359e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c359e:
    puStack_228 = (uv_loop_t *)0x1c35ad;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c35ad:
    puStack_228 = (uv_loop_t *)0x1c35bc;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  puStack_228 = (uv_loop_t *)run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  puStack_330 = (uv_loop_t *)0x1c35e9;
  puStack_228 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_310);
  uStack_300.data = (void *)(long)iVar1;
  lStack_320 = 0;
  if (uStack_300.data == (void *)0x0) {
    puStack_330 = (uv_loop_t *)0x1c360e;
    puVar2 = uv_default_loop();
    puStack_330 = (uv_loop_t *)0x1c361b;
    iVar1 = uv_tcp_init(puVar2,&uStack_300);
    lStack_320 = (long)iVar1;
    lStack_318 = 0;
    if (lStack_320 != 0) goto LAB_001c36d6;
    puStack_330 = (uv_loop_t *)0x1c364f;
    iVar1 = uv_tcp_bind(&uStack_300,(sockaddr *)&sStack_310,1);
    lStack_320 = (long)iVar1;
    lStack_318 = -0x16;
    if (lStack_320 != -0x16) goto LAB_001c36e5;
    puStack_330 = (uv_loop_t *)0x1c3670;
    unaff_RBX = uv_default_loop();
    puStack_330 = (uv_loop_t *)0x1c3684;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_330 = (uv_loop_t *)0x1c368e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_320 = 0;
    puStack_330 = (uv_loop_t *)0x1c369c;
    puVar2 = uv_default_loop();
    puStack_330 = (uv_loop_t *)0x1c36a4;
    iVar1 = uv_loop_close(puVar2);
    lStack_318 = (long)iVar1;
    if (lStack_320 == lStack_318) {
      puStack_330 = (uv_loop_t *)0x1c36bc;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_330 = (uv_loop_t *)0x1c36d6;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c36d6:
    puStack_330 = (uv_loop_t *)0x1c36e5;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c36e5:
    puStack_330 = (uv_loop_t *)0x1c36f4;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  puStack_330 = (uv_loop_t *)run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  puStack_428 = (uv_loop_t *)0x1c3710;
  puStack_330 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_428 = (uv_loop_t *)0x1c371d;
  iVar1 = uv_tcp_init(puVar2,&uStack_408);
  lStack_410 = (long)iVar1;
  lStack_418 = 0;
  if (lStack_410 == 0) {
    puStack_428 = (uv_loop_t *)0x1c374e;
    iVar1 = uv_listen((uv_stream_t *)&uStack_408,0x80,(uv_connection_cb)0x0);
    lStack_410 = (long)iVar1;
    lStack_418 = 0;
    if (lStack_410 != 0) goto LAB_001c37d5;
    puStack_428 = (uv_loop_t *)0x1c376f;
    unaff_RBX = uv_default_loop();
    puStack_428 = (uv_loop_t *)0x1c3783;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_428 = (uv_loop_t *)0x1c378d;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_410 = 0;
    puStack_428 = (uv_loop_t *)0x1c379b;
    puVar2 = uv_default_loop();
    puStack_428 = (uv_loop_t *)0x1c37a3;
    iVar1 = uv_loop_close(puVar2);
    lStack_418 = (long)iVar1;
    if (lStack_410 == lStack_418) {
      puStack_428 = (uv_loop_t *)0x1c37bb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_428 = (uv_loop_t *)0x1c37d5;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c37d5:
    puStack_428 = (uv_loop_t *)0x1c37e4;
    run_test_tcp_listen_without_bind_cold_2();
  }
  puStack_428 = (uv_loop_t *)run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  puStack_660 = (uv_loop_t *)0x1c3811;
  puStack_428 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_5e8);
  uStack_500.data = (void *)(long)iVar1;
  uStack_5d8.data = (void *)0x0;
  if (uStack_500.data == (void *)0x0) {
    puStack_660 = (uv_loop_t *)0x1c3842;
    puVar2 = uv_default_loop();
    puStack_660 = (uv_loop_t *)0x1c3852;
    iVar1 = uv_tcp_init(puVar2,&uStack_500);
    uStack_5d8.data = (void *)(long)iVar1;
    uStack_640.data = (void *)0x0;
    if (uStack_5d8.data != (void *)0x0) goto LAB_001c3ada;
    puStack_660 = (uv_loop_t *)0x1c388c;
    iVar1 = uv_tcp_bind(&uStack_500,(sockaddr *)&sStack_5e8,0);
    uStack_5d8.data = (void *)(long)iVar1;
    uStack_640.data = (void *)0x0;
    if (uStack_5d8.data != (void *)0x0) goto LAB_001c3aec;
    puStack_660 = (uv_loop_t *)0x1c38c6;
    iVar1 = uv_listen((uv_stream_t *)&uStack_500,0x80,(uv_connection_cb)0x0);
    uStack_5d8.data = (void *)(long)iVar1;
    uStack_640.data = (void *)0x0;
    if (uStack_5d8.data != (void *)0x0) goto LAB_001c3afe;
    puStack_660 = (uv_loop_t *)0x1c38f9;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_500);
    uStack_5d8.data = (void *)(long)iVar1;
    uStack_640.data = (void *)0x0;
    if (uStack_5d8.data != (void *)0x0) goto LAB_001c3b10;
    puStack_660 = (uv_loop_t *)0x1c392c;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_500);
    uStack_5d8.data = (void *)(long)iVar1;
    uStack_640.data = (void *)0x0;
    if (uStack_5d8.data != (void *)0x0) goto LAB_001c3b22;
    puStack_660 = (uv_loop_t *)0x1c3963;
    uStack_510 = uv_buf_init("PING",4);
    puStack_660 = (uv_loop_t *)0x1c3992;
    iVar1 = uv_write(&uStack_5d8,(uv_stream_t *)&uStack_500,&uStack_510,1,(uv_write_cb)0x0);
    uStack_640.data = (void *)(long)iVar1;
    lStack_650 = -0x20;
    if (uStack_640.data != (void *)0xffffffffffffffe0) goto LAB_001c3b34;
    puStack_660 = (uv_loop_t *)0x1c39c6;
    iVar1 = uv_shutdown(&uStack_640,(uv_stream_t *)&uStack_500,(uv_shutdown_cb)0x0);
    lStack_650 = (long)iVar1;
    lStack_648 = -0x6b;
    if (lStack_650 != -0x6b) goto LAB_001c3b43;
    puStack_660 = (uv_loop_t *)0x1c39fd;
    iVar1 = uv_read_start((uv_stream_t *)&uStack_500,abort,abort);
    lStack_650 = (long)iVar1;
    lStack_648 = -0x6b;
    if (lStack_650 != -0x6b) goto LAB_001c3b52;
    puStack_660 = (uv_loop_t *)0x1c3a31;
    uv_close((uv_handle_t *)&uStack_500,close_cb);
    puStack_660 = (uv_loop_t *)0x1c3a36;
    puVar2 = uv_default_loop();
    puStack_660 = (uv_loop_t *)0x1c3a40;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_650 = 1;
    lStack_648 = (long)close_cb_called;
    if (lStack_648 != 1) goto LAB_001c3b61;
    puStack_660 = (uv_loop_t *)0x1c3a6a;
    unaff_RBX = uv_default_loop();
    puStack_660 = (uv_loop_t *)0x1c3a7e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_660 = (uv_loop_t *)0x1c3a88;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_650 = 0;
    puStack_660 = (uv_loop_t *)0x1c3a96;
    puVar2 = uv_default_loop();
    puStack_660 = (uv_loop_t *)0x1c3a9e;
    iVar1 = uv_loop_close(puVar2);
    lStack_648 = (long)iVar1;
    if (lStack_650 == lStack_648) {
      puStack_660 = (uv_loop_t *)0x1c3aba;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_660 = (uv_loop_t *)0x1c3ada;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c3ada:
    puStack_660 = (uv_loop_t *)0x1c3aec;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c3aec:
    puStack_660 = (uv_loop_t *)0x1c3afe;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c3afe:
    puStack_660 = (uv_loop_t *)0x1c3b10;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c3b10:
    puStack_660 = (uv_loop_t *)0x1c3b22;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c3b22:
    puStack_660 = (uv_loop_t *)0x1c3b34;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c3b34:
    puStack_660 = (uv_loop_t *)0x1c3b43;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c3b43:
    puStack_660 = (uv_loop_t *)0x1c3b52;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c3b52:
    puStack_660 = (uv_loop_t *)0x1c3b61;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c3b61:
    puStack_660 = (uv_loop_t *)0x1c3b70;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  puStack_660 = (uv_loop_t *)run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  uStack_744 = 0;
  uStack_73c = 0;
  auStack_750._8_4_ = 0xf270002;
  puStack_660 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&uStack_738);
  auStack_750._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_750._0_8_ == (void *)0x0) {
    uv_close((uv_handle_t *)&uStack_738,(uv_close_cb)0x0);
    iVar1 = uv_tcp_bind(&uStack_738,(sockaddr *)(auStack_750 + 8),0);
    auStack_750._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_750._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3cd5;
    iVar1 = uv_listen((uv_stream_t *)&uStack_738,5,(uv_connection_cb)0x0);
    auStack_750._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_750._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3ce4;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_750._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_750._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_750._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_750._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c3d02;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c3cd5:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c3ce4:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c3d02:
  handle = (uv_handle_t *)auStack_750;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}